

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.c
# Opt level: O3

void av1_cnn_batchnorm_c(float **image,int channels,int width,int height,int stride,float *gamma,
                        float *beta,float *mean,float *std)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  float *pfVar8;
  
  if (0 < channels) {
    uVar7 = 0;
    do {
      if (0 < height) {
        fVar1 = gamma[uVar7];
        fVar2 = beta[uVar7];
        fVar3 = mean[uVar7];
        fVar4 = std[uVar7];
        pfVar8 = image[uVar7];
        iVar5 = 0;
        do {
          if (0 < width) {
            uVar6 = 0;
            do {
              pfVar8[uVar6] = ((pfVar8[uVar6] - fVar3) * fVar1) / fVar4 + fVar2;
              uVar6 = uVar6 + 1;
            } while ((uint)width != uVar6);
          }
          iVar5 = iVar5 + 1;
          pfVar8 = pfVar8 + stride;
        } while (iVar5 != height);
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != (uint)channels);
  }
  return;
}

Assistant:

void av1_cnn_batchnorm_c(float **image, int channels, int width, int height,
                         int stride, const float *gamma, const float *beta,
                         const float *mean, const float *std) {
  assert(gamma && beta && beta && std && "batchnorm has null parameter!");
  for (int ch = 0; ch < channels; ch++) {
    const float ch_gamma = gamma[ch];
    const float ch_beta = beta[ch];
    const float ch_mean = mean[ch];
    const float ch_std = std[ch];
    float *image_row = image[ch];

    for (int row = 0; row < height; row++) {
      for (int col = 0; col < width; col++) {
        image_row[col] =
            ch_gamma * (image_row[col] - ch_mean) / ch_std + ch_beta;
      }
      image_row += stride;
    }
  }
}